

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateSiblings
          (FileGenerator *this,string *package_dir,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_list)

{
  bool bVar1;
  Context *pCVar2;
  long lVar3;
  GeneratorFactory *pGVar4;
  string *psVar5;
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
  *psVar6;
  int iVar7;
  long *plVar8;
  undefined4 extraout_var;
  ZeroCopyOutputStream *pZVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *psVar11;
  FileDescriptor *pFVar12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  pointer pbVar13;
  size_type *psVar14;
  AnnotationCollector *pAVar15;
  char *__function;
  long lVar16;
  long lVar17;
  string filename;
  string info_full_path;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector_2;
  GeneratedCodeInfo annotations;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  EnumLiteGenerator generator;
  value_type local_1e0;
  string *local_1c0;
  value_type local_1b8;
  Descriptor *local_198;
  AnnotationCollector local_190;
  GeneratedCodeInfo *local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  undefined1 local_170 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_138;
  string *local_130;
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
  *local_128;
  undefined1 local_120 [24];
  long lStack_108;
  AnnotationCollector local_98;
  GeneratedCodeInfo *local_90;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [4];
  string *local_38;
  ZeroCopyOutputStream *pZVar9;
  undefined4 extraout_var_00;
  
  pFVar12 = this->file_;
  if (*(char *)(*(long *)(pFVar12 + 0xa0) + 0xa0) == '\x01') {
    local_198 = (Descriptor *)context;
    local_140 = annotation_list;
    local_138 = file_list;
    local_130 = package_dir;
    if (0 < *(int *)(pFVar12 + 0x68)) {
      local_1c0 = &this->java_package_;
      lVar17 = 0;
      lVar16 = 0;
      do {
        pCVar2 = (this->context_).ptr_;
        if (pCVar2 == (Context *)0x0) goto LAB_0026de82;
        if (((pCVar2->options_).enforce_lite == false) &&
           (*(int *)(*(long *)(pFVar12 + 0xa0) + 0xa8) != 3)) {
          EnumGenerator::EnumGenerator
                    ((EnumGenerator *)local_88,
                     (EnumDescriptor *)(*(long *)(pFVar12 + 0x70) + lVar17),this->immutable_api_,
                     pCVar2);
          lVar3 = *(long *)(this->file_ + 0x70);
          bVar1 = (this->options_).annotate_code;
          local_188 = (GeneratedCodeInfo *)0x0;
          local_180 = 0;
          local_190._vptr_AnnotationCollector = (_func_int **)&local_180;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_170,local_130,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (lVar3 + lVar17));
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_170,(ulong)local_190._vptr_AnnotationCollector);
          local_120._0_8_ = local_120 + 0x10;
          pbVar13 = (pointer)(plVar8 + 2);
          if ((pointer)*plVar8 == pbVar13) {
            local_120._16_8_ = (pbVar13->_M_dataplus)._M_p;
            lStack_108 = plVar8[3];
          }
          else {
            local_120._16_8_ = (pbVar13->_M_dataplus)._M_p;
            local_120._0_8_ = (pointer)*plVar8;
          }
          local_120._8_8_ = plVar8[1];
          *plVar8 = (long)pbVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append(local_120);
          psVar14 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_1e0.field_2._M_allocated_capacity = *psVar14;
            local_1e0.field_2._8_8_ = plVar8[3];
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          }
          else {
            local_1e0.field_2._M_allocated_capacity = *psVar14;
            local_1e0._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_1e0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((pointer)local_120._0_8_ != (pointer)(local_120 + 0x10)) {
            operator_delete((void *)local_120._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_120._16_8_)->_M_p + 1));
          }
          if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
            operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_138,&local_1e0);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,local_1e0._M_dataplus._M_p,
                     local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
          std::__cxx11::string::append((char *)&local_1b8);
          GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_170);
          local_98._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_00425e08;
          local_90 = (GeneratedCodeInfo *)local_170;
          iVar7 = (*(*(_func_int ***)local_198)[2])(local_198,&local_1e0);
          pZVar9 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar7);
          pAVar15 = (AnnotationCollector *)0x0;
          if (bVar1 != false) {
            pAVar15 = &local_98;
          }
          io::Printer::Printer((Printer *)local_120,pZVar9,'$',pAVar15);
          io::Printer::Print((Printer *)local_120,
                             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                             ,"filename",(string *)**(undefined8 **)(lVar3 + 0x10 + lVar17));
          if ((this->java_package_)._M_string_length != 0) {
            io::Printer::Print((Printer *)local_120,"package $package$;\n\n","package",local_1c0);
          }
          EnumGenerator::Generate((EnumGenerator *)local_88,(Printer *)local_120);
          if (bVar1 != false) {
            iVar7 = (*(*(_func_int ***)local_198)[2])(local_198,&local_1b8);
            pZVar10 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar7);
            MessageLite::SerializeToZeroCopyStream((MessageLite *)local_170,pZVar10);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_140,&local_1b8);
            if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar10->_vptr_ZeroCopyOutputStream[1])(pZVar10);
            }
          }
          io::Printer::~Printer((Printer *)local_120);
          if (pZVar9 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar9->_vptr_ZeroCopyOutputStream[1])(pZVar9);
          }
          GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,
                            CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                     local_1b8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
          if (local_190._vptr_AnnotationCollector != (_func_int **)&local_180) {
            operator_delete(local_190._vptr_AnnotationCollector,CONCAT71(uStack_17f,local_180) + 1);
          }
          EnumGenerator::~EnumGenerator((EnumGenerator *)local_88);
        }
        else {
          EnumLiteGenerator::EnumLiteGenerator
                    ((EnumLiteGenerator *)local_88,
                     (EnumDescriptor *)(*(long *)(pFVar12 + 0x70) + lVar17),this->immutable_api_,
                     pCVar2);
          lVar3 = *(long *)(this->file_ + 0x70);
          bVar1 = (this->options_).annotate_code;
          local_188 = (GeneratedCodeInfo *)0x0;
          local_180 = 0;
          local_190._vptr_AnnotationCollector = (_func_int **)&local_180;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_170,local_130,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (lVar3 + lVar17));
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_170,(ulong)local_190._vptr_AnnotationCollector);
          local_120._0_8_ = local_120 + 0x10;
          pbVar13 = (pointer)(plVar8 + 2);
          if ((pointer)*plVar8 == pbVar13) {
            local_120._16_8_ = (pbVar13->_M_dataplus)._M_p;
            lStack_108 = plVar8[3];
          }
          else {
            local_120._16_8_ = (pbVar13->_M_dataplus)._M_p;
            local_120._0_8_ = (pointer)*plVar8;
          }
          local_120._8_8_ = plVar8[1];
          *plVar8 = (long)pbVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append(local_120);
          psVar14 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_1e0.field_2._M_allocated_capacity = *psVar14;
            local_1e0.field_2._8_8_ = plVar8[3];
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          }
          else {
            local_1e0.field_2._M_allocated_capacity = *psVar14;
            local_1e0._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_1e0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((pointer)local_120._0_8_ != (pointer)(local_120 + 0x10)) {
            operator_delete((void *)local_120._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_120._16_8_)->_M_p + 1));
          }
          if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
            operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_138,&local_1e0);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,local_1e0._M_dataplus._M_p,
                     local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
          std::__cxx11::string::append((char *)&local_1b8);
          GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_170);
          local_98._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_00425e08;
          local_90 = (GeneratedCodeInfo *)local_170;
          iVar7 = (*(*(_func_int ***)local_198)[2])(local_198,&local_1e0);
          pZVar9 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar7);
          pAVar15 = (AnnotationCollector *)0x0;
          if (bVar1 != false) {
            pAVar15 = &local_98;
          }
          io::Printer::Printer((Printer *)local_120,pZVar9,'$',pAVar15);
          io::Printer::Print((Printer *)local_120,
                             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                             ,"filename",(string *)**(undefined8 **)(lVar3 + 0x10 + lVar17));
          if ((this->java_package_)._M_string_length != 0) {
            io::Printer::Print((Printer *)local_120,"package $package$;\n\n","package",local_1c0);
          }
          EnumLiteGenerator::Generate((EnumLiteGenerator *)local_88,(Printer *)local_120);
          if (bVar1 != false) {
            iVar7 = (*(*(_func_int ***)local_198)[2])(local_198,&local_1b8);
            pZVar10 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar7);
            MessageLite::SerializeToZeroCopyStream((MessageLite *)local_170,pZVar10);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_140,&local_1b8);
            if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar10->_vptr_ZeroCopyOutputStream[1])(pZVar10);
            }
          }
          io::Printer::~Printer((Printer *)local_120);
          if (pZVar9 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar9->_vptr_ZeroCopyOutputStream[1])(pZVar9);
          }
          GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,
                            CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                     local_1b8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
          if (local_190._vptr_AnnotationCollector != (_func_int **)&local_180) {
            operator_delete(local_190._vptr_AnnotationCollector,CONCAT71(uStack_17f,local_180) + 1);
          }
          EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)local_88);
        }
        lVar16 = lVar16 + 1;
        pFVar12 = this->file_;
        lVar17 = lVar17 + 0x38;
      } while (lVar16 < *(int *)(pFVar12 + 0x68));
    }
    pFVar12 = this->file_;
    if (0 < *(int *)(pFVar12 + 0x58)) {
      pbVar13 = (pointer)(local_120 + 0x10);
      local_1c0 = &this->java_package_;
      local_128 = &this->message_generators_;
      lVar16 = 0;
      lVar17 = 0;
      do {
        if (this->immutable_api_ == true) {
          bVar1 = (this->options_).annotate_code;
          lVar3 = *(long *)(pFVar12 + 0x60);
          local_120._16_8_ = (pointer)0x65646c697542724f;
          local_120._8_8_ = (pointer)0x9;
          lStack_108 = CONCAT62(lStack_108._2_6_,0x72);
          local_120._0_8_ = pbVar13;
          psVar11 = internal::
                    scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                    ::operator[](local_128,lVar17);
          local_88._0_8_ = (EnumDescriptor *)0x29;
          local_88._8_8_ = (void *)0x0;
          GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                    ((java *)local_130,local_1c0,(string *)(lVar3 + lVar16),local_198,
                     (GeneratorContext *)local_138,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(ulong)bVar1,SUB81(local_140,0),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_120,(string *)psVar11->ptr_,(MessageGenerator *)0x29,0);
          if ((pointer)local_120._0_8_ != pbVar13) {
            operator_delete((void *)local_120._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_120._16_8_)->_M_p + 1));
          }
        }
        bVar1 = (this->options_).annotate_code;
        lVar3 = *(long *)(this->file_ + 0x60);
        local_120._8_8_ = (pointer)0x0;
        local_120._16_8_ = local_120._16_8_ & 0xffffffffffffff00;
        local_120._0_8_ = pbVar13;
        psVar11 = internal::
                  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                  ::operator[](local_128,lVar17);
        local_88._0_8_ = (EnumDescriptor *)0x21;
        local_88._8_8_ = (void *)0x0;
        GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                  ((java *)local_130,local_1c0,(string *)(lVar3 + lVar16),local_198,
                   (GeneratorContext *)local_138,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(ulong)bVar1,SUB81(local_140,0),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_120,(string *)psVar11->ptr_,(MessageGenerator *)0x21,0);
        if ((pointer)local_120._0_8_ != pbVar13) {
          operator_delete((void *)local_120._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_120._16_8_)->_M_p + 1));
        }
        lVar17 = lVar17 + 1;
        pFVar12 = this->file_;
        lVar16 = lVar16 + 0xa8;
      } while (lVar17 < *(int *)(pFVar12 + 0x58));
    }
    pCVar2 = (this->context_).ptr_;
    if (pCVar2 == (Context *)0x0) {
LAB_0026de82:
      __function = 
      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->() const [C = google::protobuf::compiler::java::Context]"
      ;
LAB_0026de97:
      __assert_fail("ptr_ != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                    ,0x5f,__function);
    }
    if ((((0 < *(int *)(pFVar12 + 0x78)) && ((pCVar2->options_).enforce_lite == false)) &&
        (*(int *)(*(long *)(pFVar12 + 0xa0) + 0xa8) != 3)) &&
       ((*(char *)(*(long *)(pFVar12 + 0xa0) + 0xa4) == '\x01' &&
        (pFVar12 = this->file_, 0 < *(int *)(pFVar12 + 0x78))))) {
      local_38 = &this->java_package_;
      lVar16 = 0;
      local_128 = (scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                   *)0x0;
      do {
        pGVar4 = (this->generator_factory_).ptr_;
        if (pGVar4 == (GeneratorFactory *)0x0) {
          __function = 
          "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::operator->() const [C = google::protobuf::compiler::java::GeneratorFactory]"
          ;
          goto LAB_0026de97;
        }
        iVar7 = (*pGVar4->_vptr_GeneratorFactory[4])(pGVar4,*(long *)(pFVar12 + 0x80) + lVar16);
        local_1c0 = (string *)CONCAT44(extraout_var_03,iVar7);
        lVar17 = *(long *)(this->file_ + 0x80);
        bVar1 = (this->options_).annotate_code;
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_local_buf[0] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                       ,local_130,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar17 + lVar16));
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_88,(ulong)local_1b8._M_dataplus._M_p);
        local_120._0_8_ = local_120 + 0x10;
        pbVar13 = (pointer)(plVar8 + 2);
        if ((pointer)*plVar8 == pbVar13) {
          local_120._16_8_ = (pbVar13->_M_dataplus)._M_p;
          lStack_108 = plVar8[3];
        }
        else {
          local_120._16_8_ = (pbVar13->_M_dataplus)._M_p;
          local_120._0_8_ = (pointer)*plVar8;
        }
        local_120._8_8_ = plVar8[1];
        *plVar8 = (long)pbVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append(local_120);
        psVar14 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar14) {
          local_170._16_8_ = *psVar14;
          local_170._24_8_ = plVar8[3];
          local_170._0_8_ = local_170 + 0x10;
        }
        else {
          local_170._16_8_ = *psVar14;
          local_170._0_8_ = (size_type *)*plVar8;
        }
        local_170._8_8_ = plVar8[1];
        *plVar8 = (long)psVar14;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((pointer)local_120._0_8_ != (pointer)(local_120 + 0x10)) {
          operator_delete((void *)local_120._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_120._16_8_)->_M_p + 1));
        }
        if ((EnumDescriptor *)local_88._0_8_ != (EnumDescriptor *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_,local_78[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_138,(value_type *)local_170);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,local_170._0_8_,(pointer)(local_170._0_8_ + local_170._8_8_)
                  );
        std::__cxx11::string::append((char *)&local_1e0);
        GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_88);
        local_190._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_00425e08;
        local_188 = (GeneratedCodeInfo *)local_88;
        iVar7 = (*(*(_func_int ***)local_198)[2])(local_198,local_170);
        pZVar9 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_04,iVar7);
        pAVar15 = (AnnotationCollector *)0x0;
        if (bVar1 != false) {
          pAVar15 = &local_190;
        }
        io::Printer::Printer((Printer *)local_120,pZVar9,'$',pAVar15);
        psVar5 = local_1c0;
        io::Printer::Print((Printer *)local_120,
                           "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                           ,"filename",(string *)**(undefined8 **)(lVar17 + 0x10 + lVar16));
        if ((this->java_package_)._M_string_length != 0) {
          io::Printer::Print((Printer *)local_120,"package $package$;\n\n","package",local_38);
        }
        (**(code **)((psVar5->_M_dataplus)._M_p + 0x10))(psVar5,local_120);
        if (bVar1 != false) {
          iVar7 = (*(*(_func_int ***)local_198)[2])(local_198,&local_1e0);
          pZVar10 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_05,iVar7);
          MessageLite::SerializeToZeroCopyStream((MessageLite *)local_88,pZVar10);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_140,&local_1e0);
          if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar10->_vptr_ZeroCopyOutputStream[1])(pZVar10);
          }
        }
        io::Printer::~Printer((Printer *)local_120);
        if (pZVar9 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar9->_vptr_ZeroCopyOutputStream[1])(pZVar9);
        }
        GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
          operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
        }
        psVar6 = local_128;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,
                          CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                   local_1b8.field_2._M_local_buf[0]) + 1);
        }
        (**(code **)((psVar5->_M_dataplus)._M_p + 8))(psVar5);
        local_128 = (scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                     *)((long)&psVar6->array_ + 1);
        pFVar12 = this->file_;
        lVar16 = lVar16 + 0x30;
      } while ((long)local_128 < (long)*(int *)(pFVar12 + 0x78));
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateSiblings(const string& package_dir,
                                     GeneratorContext* context,
                                     std::vector<string>* file_list,
                                     std::vector<string>* annotation_list) {
  if (MultipleJavaFiles(file_, immutable_api_)) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      if (HasDescriptorMethods(file_, context_->EnforceLite())) {
        EnumGenerator generator(file_->enum_type(i), immutable_api_,
                                context_.get());
        GenerateSibling<EnumGenerator>(
            package_dir, java_package_, file_->enum_type(i), context, file_list,
            options_.annotate_code, annotation_list, "", &generator,
            &EnumGenerator::Generate);
      } else {
        EnumLiteGenerator generator(file_->enum_type(i), immutable_api_,
                                    context_.get());
        GenerateSibling<EnumLiteGenerator>(
            package_dir, java_package_, file_->enum_type(i), context, file_list,
            options_.annotate_code, annotation_list, "", &generator,
            &EnumLiteGenerator::Generate);
      }
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      if (immutable_api_) {
        GenerateSibling<MessageGenerator>(
            package_dir, java_package_, file_->message_type(i), context,
            file_list, options_.annotate_code, annotation_list, "OrBuilder",
            message_generators_[i].get(), &MessageGenerator::GenerateInterface);
      }
      GenerateSibling<MessageGenerator>(
          package_dir, java_package_, file_->message_type(i), context,
          file_list, options_.annotate_code, annotation_list, "",
          message_generators_[i].get(), &MessageGenerator::Generate);
    }
    if (HasGenericServices(file_, context_->EnforceLite())) {
      for (int i = 0; i < file_->service_count(); i++) {
        google::protobuf::scoped_ptr<ServiceGenerator> generator(
            generator_factory_->NewServiceGenerator(file_->service(i)));
        GenerateSibling<ServiceGenerator>(
            package_dir, java_package_, file_->service(i), context, file_list,
            options_.annotate_code, annotation_list, "", generator.get(),
            &ServiceGenerator::Generate);
      }
    }
  }
}